

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split-options.cpp
# Opt level: O2

bool __thiscall wasm::WasmSplitOptions::validate(WasmSplitOptions *this)

{
  pointer pbVar1;
  WasmSplitOptions *pWVar2;
  ulong uVar3;
  size_type sVar4;
  ostream *poVar5;
  char *msg_00;
  pointer __k;
  bool bVar6;
  stringstream local_1f0 [8];
  stringstream msg;
  ostream local_1e0 [376];
  string local_68 [32];
  WasmSplitOptions *local_48;
  undefined1 *local_40;
  anon_class_8_1_a8c67f1c fail;
  bool valid;
  
  local_40 = (undefined1 *)((long)&fail.valid + 7);
  fail.valid._7_1_ = 1;
  if ((this->inputFiles).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->inputFiles).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    validate()::$_0::operator()((__0 *)&local_40,"no input file");
  }
  if (this->mode < MergeProfiles) {
    if ((ulong)((long)(this->inputFiles).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->inputFiles).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) < 0x21) goto LAB_0011f29d;
    msg_00 = "Cannot have more than one input file.";
  }
  else {
    if ((this->mode != PrintProfile) ||
       ((long)(this->inputFiles).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->inputFiles).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x20)) goto LAB_0011f29d;
    msg_00 = "Must have exactly one profile path.";
  }
  validate()::$_0::operator()((__0 *)&local_40,msg_00);
LAB_0011f29d:
  pbVar1 = (this->usedOptions).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_48 = this;
  for (__k = (this->usedOptions).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start; pWVar2 = local_48, uVar3 = (ulong)this->mode
      , __k != pbVar1; __k = __k + 1) {
    sVar4 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::count(&(this->validOptions)._M_elems[uVar3]._M_h,__k);
    if (sVar4 == 0) {
      std::__cxx11::stringstream::stringstream(local_1f0);
      poVar5 = std::operator<<(local_1e0,"Option ");
      poVar5 = std::operator<<(poVar5,(string *)__k);
      poVar5 = std::operator<<(poVar5," cannot be used in ");
      anon_unknown_12::operator<<(poVar5,&this->mode);
      std::operator<<(poVar5," mode.");
      std::__cxx11::stringbuf::str();
      poVar5 = std::operator<<((ostream *)&std::cerr,"error: ");
      poVar5 = std::operator<<(poVar5,local_68);
      std::operator<<(poVar5,"\n");
      fail.valid._7_1_ = 0;
      std::__cxx11::string::~string(local_68);
      std::__cxx11::stringstream::~stringstream(local_1f0);
    }
  }
  if (uVar3 == 0) {
    if ((local_48->profileFile)._M_string_length != 0) {
      if ((local_48->keepFuncs)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        bVar6 = false;
      }
      else {
        validate()::$_0::operator()((__0 *)&local_40,"Cannot use both --profile and --keep-funcs.");
        bVar6 = (pWVar2->profileFile)._M_string_length == 0;
      }
      if ((!bVar6) && ((pWVar2->splitFuncs)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0))
      {
        validate()::$_0::operator()((__0 *)&local_40,"Cannot use both --profile and --split-funcs.")
        ;
      }
    }
    if (((pWVar2->keepFuncs)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) &&
       ((pWVar2->splitFuncs)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
      validate()::$_0::operator()
                ((__0 *)&local_40,"Cannot use both --keep-funcs and --split-funcs.");
    }
  }
  return (bool)fail.valid._7_1_;
}

Assistant:

bool WasmSplitOptions::validate() {
  bool valid = true;
  auto fail = [&](auto msg) {
    std::cerr << "error: " << msg << "\n";
    valid = false;
  };

  // Validate the positional arguments.
  if (inputFiles.size() == 0) {
    fail("no input file");
  }
  switch (mode) {
    case Mode::Split:
    case Mode::Instrument:
      if (inputFiles.size() > 1) {
        fail("Cannot have more than one input file.");
      }
      break;
    case Mode::MergeProfiles:
      // Any number >= 1 allowed.
      break;
    case Mode::PrintProfile:
      if (inputFiles.size() != 1) {
        fail("Must have exactly one profile path.");
      }
      break;
  }

  // Validate that all used options are allowed in the current mode.
  for (std::string& opt : usedOptions) {
    if (!validOptions[static_cast<unsigned>(mode)].count(opt)) {
      std::stringstream msg;
      msg << "Option " << opt << " cannot be used in " << mode << " mode.";
      fail(msg.str());
    }
  }

  if (mode == Mode::Split) {
    if (profileFile.size() && keepFuncs.size()) {
      fail("Cannot use both --profile and --keep-funcs.");
    }
    if (profileFile.size() && splitFuncs.size()) {
      fail("Cannot use both --profile and --split-funcs.");
    }
    if (keepFuncs.size() && splitFuncs.size()) {
      fail("Cannot use both --keep-funcs and --split-funcs.");
    }
  }

  return valid;
}